

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Satisfier<CPubKey>::ToPKBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          Satisfier<CPubKey> *this,Key *key)

{
  byte bVar1;
  long lVar2;
  long in_FS_OFFSET;
  allocator_type local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((key->vch[0] & 0xfe) == 2) {
    lVar2 = 0x21;
  }
  else {
    bVar1 = key->vch[0] - 4;
    if (bVar1 < 4) {
      lVar2 = *(long *)(&DAT_00b70b20 + (ulong)bVar1 * 8);
    }
    else {
      lVar2 = 0;
    }
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,key->vch,
             key->vch + lVar2,&local_11);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ToPKBytes(const Key& key) const { return {key.begin(), key.end()}; }